

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
visitor_test_should_try_get_fields_after_parsing_Test::TestBody
          (visitor_test_should_try_get_fields_after_parsing_Test *this)

{
  char *in_R9;
  undefined1 local_98 [8];
  VisitError<typename_Visitor::ResultType> err;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  
  doVisit<should_try_get_fields_after_parsing::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
            (local_98,
             "8=FIX.4.2|9=84|35=A|34=1|49=ABC|52=20120309-16:54:02|56=TT_ORDER|96=12345678|384=2|372=TEST|385=C|372=TEST|10=248"
            );
  err.storage_.initialized_ = local_98[0];
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_98[0] == false) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&err.storage_.initialized_,
               (AssertionResult *)"err.isOk()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x336,(char *)gtest_ar_.message_.ptr_);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_);
  Fixpp::result::Result<void,_Fixpp::ErrorKind>::~Result((Result<void,_Fixpp::ErrorKind> *)local_98)
  ;
  return;
}

Assistant:

TEST(visitor_test, should_try_get_fields_after_parsing)
{
    const char* frame = "8=FIX.4.2|9=84|35=A|34=1|49=ABC|52=20120309-16:54:02|56=TT_ORDER|96=12345678|384=2|372=TEST|385=C|372=TEST|10=248";

    auto err = doVisit(frame, should_try_get_fields_after_parsing::Visitor(), should_try_get_fields_after_parsing::VisitRules());
    ASSERT_TRUE(err.isOk());
}